

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_Monthly.cpp
# Opt level: O2

void OnPreUpdateLadder(LadderDatabase *database,Server *param_2,TeamType *param_3)

{
  tm *ptVar1;
  time_t current_time;
  time_t local_20;
  
  local_20 = time((time_t *)0x0);
  ptVar1 = gmtime(&local_20);
  if (pluginInstance.last_sorted_month != ptVar1->tm_mon) {
    RenX::LadderDatabase::erase();
    pluginInstance.last_sorted_month = ptVar1->tm_mon;
  }
  return;
}

Assistant:

void OnPreUpdateLadder(RenX::LadderDatabase &database, RenX::Server &, const RenX::TeamType &) {
	time_t current_time = time(0);
	tm *tm_ptr = gmtime(&current_time);
	if (pluginInstance.last_sorted_month != tm_ptr->tm_mon) {
		database.erase();
	}
	pluginInstance.last_sorted_month = tm_ptr->tm_mon;
}